

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void fight_prog_law_subdue(CHAR_DATA *mob,CHAR_DATA *ch)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  CHAR_DATA *pCVar5;
  ulong uVar6;
  ROOM_INDEX_DATA *pRoomIndex;
  char *pcVar7;
  undefined *puVar8;
  char *pcVar9;
  char *pcVar10;
  string_view fmt;
  format_args args;
  CHAR_DATA *ch_local;
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  float local_2f8;
  int local_2f4;
  string buffer;
  ROOM_INDEX_DATA *pRoom;
  char *local_2c8 [2];
  char *local_2b8;
  char *local_2a8;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  AFFECT_DATA af;
  
  ch_local = ch;
  pCVar5 = get_char_room(mob,"hydra trooper soldier");
  if (pCVar5 == (CHAR_DATA *)0x0) {
    return;
  }
  pCVar5 = get_char_room(mob,"dragon trooper soldier");
  if (pCVar5 == (CHAR_DATA *)0x0) {
    return;
  }
  bVar2 = is_affected(ch,(int)gsn_aggressor);
  if (!bVar2) {
    return;
  }
  local_2f8 = ((float)ch->hit / (float)(int)ch->max_hit) * 100.0 + 10.0;
  iVar3 = number_percent();
  if ((float)iVar3 <= local_2f8) {
    act("The troopers maneuver around you, waiting for an opening.",mob,(void *)0x0,ch,2);
    act("The troopers maneuver around $N, waiting for an opening.",mob,(void *)0x0,ch,1);
    return;
  }
  stop_fighting(ch,true);
  stop_fighting(mob,true);
  mob->last_fought = (CHAR_DATA *)0x0;
  mob->tracktimer = 0;
  iVar3 = number_range(1,2);
  pcVar9 = "You crumple as the Dragon trooper lands a hefty blow on the side of your head!";
  if (iVar3 == 1) {
    pcVar9 = "The Hydra trooper dives at your legs, binding you, and you topple to the ground!";
  }
  iVar3 = 0;
  act(pcVar9,mob,(void *)0x0,ch,2);
  act("The troopers leap on top of you, and you find yourself quickly immobilized!",mob,(void *)0x0,
      ch,2);
  act("The troopers leap on top of $N, and $N finds $Mself quickly immobilized!",mob,(void *)0x0,ch,
      1);
  act("You hear the wet sounds of impact against your skull, and everything goes black.",mob,
      (void *)0x0,ch,2);
  act("$N\'s inert form is dragged away toward the gates.",mob,(void *)0x0,ch,1);
  ch->position = 4;
  init_affect(&af);
  af.where = 0;
  af.type = gsn_subdue;
  af.aftype = 5;
  af.bitvector[0]._2_1_ = af.bitvector[0]._2_1_ | 2;
  af.level = 0x3c;
  af.duration = 0xc;
  affect_to_char(ch_local,&af);
  sVar1 = mob->pIndexData->vnum;
  switch(sVar1) {
  case 0xa8c:
    uVar4 = number_range(0,3);
    iVar3 = 0;
    if (3 < uVar4) goto switchD_00339489_caseD_a99;
    uVar6 = (ulong)uVar4;
    puVar8 = &DAT_003f75b0;
    break;
  case 0xa8d:
  case 0xa8e:
  case 0xa90:
  case 0xa91:
  case 0xa93:
  case 0xa94:
    goto switchD_00339489_caseD_a99;
  case 0xa8f:
    uVar4 = number_range(0,4);
    iVar3 = 0;
    if (4 < uVar4) goto switchD_00339489_caseD_a99;
    uVar6 = (ulong)uVar4;
    puVar8 = &DAT_003f7538;
    break;
  case 0xa92:
    uVar4 = number_range(0,3);
    iVar3 = uVar4 + 0x916;
    goto LAB_003395c0;
  case 0xa95:
    uVar4 = number_range(0,3);
    iVar3 = uVar4 + 0xc9;
LAB_003395c0:
    if (3 < uVar4) {
      iVar3 = 0;
    }
    goto switchD_00339489_caseD_a99;
  default:
    switch(sVar1) {
    case 0xa98:
      uVar4 = number_range(0,3);
      iVar3 = 0;
      if (3 < uVar4) goto switchD_00339489_caseD_a99;
      uVar6 = (ulong)uVar4;
      puVar8 = &DAT_003f75c0;
      break;
    case 0xa99:
    case 0xa9a:
    case 0xa9c:
    case 0xa9d:
    case 0xa9f:
    case 0xaa0:
      goto switchD_00339489_caseD_a99;
    case 0xa9b:
      uVar4 = number_range(0,3);
      iVar3 = uVar4 + 0x91b;
      goto LAB_003395c0;
    case 0xa9e:
      uVar4 = number_range(0,3);
      iVar3 = 0;
      if (3 < uVar4) goto switchD_00339489_caseD_a99;
      uVar6 = (ulong)uVar4;
      puVar8 = &DAT_003f75d0;
      break;
    case 0xaa1:
      uVar4 = number_range(0,2);
      iVar3 = 0;
      if (2 < uVar4) goto switchD_00339489_caseD_a99;
      uVar6 = (ulong)uVar4;
      puVar8 = &DAT_003f754c;
      break;
    default:
      if (sVar1 != 0x96a) goto switchD_00339489_caseD_a99;
      uVar4 = number_range(0,4);
      iVar3 = 0;
      if (4 < uVar4) goto switchD_00339489_caseD_a99;
      uVar6 = (ulong)uVar4;
      puVar8 = &DAT_003f7524;
    }
  }
  iVar3 = *(int *)(puVar8 + uVar6 * 4);
switchD_00339489_caseD_a99:
  pRoom = get_room_index(iVar3);
  bVar2 = is_affected(ch_local,(int)gsn_plasma_thread);
  if (bVar2) {
    switchD_00333f01::default(ch_local,(int)gsn_plasma_thread);
  }
  char_from_room(ch_local);
  pCVar5 = ch_local;
  pRoomIndex = get_room_index(5);
  char_to_room(pCVar5,pRoomIndex);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"fight_prog_law_subdue",(allocator<char> *)local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"send_to_char_queue",(allocator<char> *)&buffer);
  CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[59],char_data*&>
            (&RS.Queue,10,&local_b0,&local_d0,send_to_char_queue,
             (char (*) [59])"You are dimly aware of being dragged along the ground...\n\r",&ch_local
            );
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"fight_prog_law_subdue",(allocator<char> *)local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"wake_up",(allocator<char> *)&buffer);
  CQueue::AddToQueue<void(*)(char_data*),char_data*&>
            (&RS.Queue,0x13,&local_f0,&local_110,wake_up,&ch_local);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"fight_prog_law_subdue",(allocator<char> *)local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"affect_strip",(allocator<char> *)&buffer);
  CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,short&>
            (&RS.Queue,0x13,&local_130,&local_150,affect_strip,&ch_local,&gsn_subdue);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"fight_prog_law_subdue",(allocator<char> *)local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"char_to_room",(allocator<char> *)&buffer);
  CQueue::AddToQueue<void(*)(char_data*,room_index_data*),char_data*&,room_index_data*&>
            (&RS.Queue,0x13,&local_170,&local_190,char_to_room,&ch_local,&pRoom);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"fight_prog_law_subdue",(allocator<char> *)local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"char_from_room",(allocator<char> *)&buffer);
  CQueue::AddToQueue<void(*)(char_data*),char_data*&>
            (&RS.Queue,0x13,&local_1b0,&local_1d0,char_from_room,&ch_local);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"fight_prog_law_subdue",(allocator<char> *)local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"send_to_char_queue",(allocator<char> *)&buffer);
  CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[79],char_data*&>
            (&RS.Queue,0x14,&local_1f0,&local_210,send_to_char_queue,
             (char (*) [79])
             "You are shaken awake by a fuzzy man, as seen through your own personal haze.\n\r",
             &ch_local);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"fight_prog_law_subdue",&local_2f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"act_queue",&local_2fa);
  local_2c8[0] = (char *)0x0;
  buffer._M_dataplus._M_p = (pointer)0x0;
  local_2f4 = 1;
  pcVar10 = "$N comes to $S knees holding the back of $S head.";
  CQueue::
  AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[50],decltype(nullptr),decltype(nullptr),char_data*&,int>
            (&RS.Queue,0x14,&local_230,&local_250,act_queue,
             (char (*) [50])"$N comes to $S knees holding the back of $S head.",(void **)local_2c8,
             (void **)&buffer,&ch_local,&local_2f4);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  pcVar9 = get_char_color(ch_local,"tells");
  pcVar7 = get_insult(ch_local);
  local_2a8 = END_COLOR(ch_local);
  fmt.size_ = 0xccc;
  fmt.data_ = (char *)0x3f;
  args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                  )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                    )pcVar10;
  args.desc_ = (unsigned_long_long)local_2c8;
  local_2c8[0] = pcVar9;
  local_2b8 = pcVar7;
  ::fmt::v9::vformat_abi_cxx11_
            (&buffer,(v9 *)"A Hydra trooper tells you \'{}And stay out of Cimar, ye {}!{}\'\n\r",fmt
             ,args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"fight_prog_law_subdue",(allocator<char> *)local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"send_to_char_queue",(allocator<char> *)&local_2f4);
  CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),std::__cxx11::string&,char_data*&>
            (&RS.Queue,0x15,&local_270,&local_290,send_to_char_queue,&buffer,&ch_local);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&buffer);
  return;
}

Assistant:

void fight_prog_law_subdue(CHAR_DATA *mob, CHAR_DATA *ch)
{
	CHAR_DATA *hydra, *dragon;
	int hydra_vnum, dragon_vnum, vnum = 0, num;
	ROOM_INDEX_DATA *pRoom;
	AFFECT_DATA af;
	float chance;

	switch (mob->pIndexData->vnum)
	{
		case 2410:
			hydra_vnum = 2409;
			dragon_vnum = 2408;
			break;
		default:
			dragon_vnum = mob->pIndexData->vnum + 1;
			hydra_vnum = mob->pIndexData->vnum + 2;
	}

	if (((hydra = get_char_room(mob, "hydra trooper soldier")) == nullptr)
		|| ((dragon = get_char_room(mob, "dragon trooper soldier")) == nullptr))
	{
		return;
	}

	if (!is_affected(ch, gsn_aggressor))
		return;

	chance = ((float)ch->hit / (float)ch->max_hit) * 100 + 10;

	if (number_percent() > chance)
	{
		stop_fighting(ch, true);
		stop_fighting(mob, true);

		mob->last_fought = nullptr;
		mob->tracktimer = 0;

		if (number_range(1, 2) == 1)
			act("The Hydra trooper dives at your legs, binding you, and you topple to the ground!", mob, 0, ch, TO_VICT);
		else
			act("You crumple as the Dragon trooper lands a hefty blow on the side of your head!", mob, 0, ch, TO_VICT);

		act("The troopers leap on top of you, and you find yourself quickly immobilized!", mob, 0, ch, TO_VICT);
		act("The troopers leap on top of $N, and $N finds $Mself quickly immobilized!", mob, 0, ch, TO_NOTVICT);
		act("You hear the wet sounds of impact against your skull, and everything goes black.", mob, 0, ch, TO_VICT);
		act("$N's inert form is dragged away toward the gates.", mob, 0, ch, TO_NOTVICT);

		ch->position = POS_SLEEPING;

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_subdue;
		af.aftype = AFT_INVIS;

		SET_BIT(af.bitvector, AFF_SLEEP);

		af.level = 60;
		af.duration = 12;
		affect_to_char(ch, &af);

		switch (mob->pIndexData->vnum)
		{
			case 2410:
				num = number_range(0, 4);

				switch (num)
				{
					case 0:
						vnum = 3502;
						break;
					case 1:
						vnum = 3507;
						break;
					case 2:
						vnum = 3509;
						break;
					case 3:
						vnum = 3516;
						break;
					case 4:
						vnum = 3517;
						break;
				}

				break;
			case 2700:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 533;
						break;
					case 1:
						vnum = 534;
						break;
					case 2:
						vnum = 542;
						break;
					case 3:
						vnum = 551;
						break;
				}

				break;
			case 2703:
				num = number_range(0, 4);

				switch (num)
				{
					case 0:
						vnum = 528;
						break;
					case 1:
						vnum = 529;
						break;
					case 2:
						vnum = 522;
						break;
					case 3:
						vnum = 523;
						break;
					case 4:
						vnum = 524;
						break;
				}

				break;
			case 2706:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 2326;
						break;
					case 1:
						vnum = 2327;
						break;
					case 2:
						vnum = 2328;
						break;
					case 3:
						vnum = 2329;
						break;
				}

				break;
			case 2709:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 201;
						break;
					case 1:
						vnum = 202;
						break;
					case 2:
						vnum = 203;
						break;
					case 3:
						vnum = 204;
						break;
				}

				break;
			case 2712:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 2319;
						break;
					case 1:
						vnum = 2320;
						break;
					case 2:
						vnum = 2321;
						break;
					case 3:
						vnum = 2323;
						break;
				}

				break;
			case 2715:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 2331;
						break;
					case 1:
						vnum = 2332;
						break;
					case 2:
						vnum = 2333;
						break;
					case 3:
						vnum = 2334;
						break;
				}

				break;
			case 2718:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 6008;
						break;
					case 1:
						vnum = 6009;
						break;
					case 2:
						vnum = 6011;
						break;
					case 3:
						vnum = 6014;
						break;
				}

				break;
			case 2721:
				num = number_range(0, 2);

				switch (num)
				{
					case 0:
						vnum = 14257;
						break;
					case 1:
						vnum = 14267;
						break;
					case 2:
						vnum = 14268;
						break;
				}

				break;
		}

		pRoom = get_room_index(vnum);

		if (is_affected(ch, gsn_plasma_thread))
			affect_strip(ch, gsn_plasma_thread);

		char_from_room(ch);
		char_to_room(ch, get_room_index(5));

		RS.Queue.AddToQueue(10, "fight_prog_law_subdue", "send_to_char_queue", send_to_char_queue, "You are dimly aware of being dragged along the ground...\n\r", ch);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "wake_up", wake_up, ch);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "affect_strip", affect_strip, ch, gsn_subdue);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "char_to_room", char_to_room, ch, pRoom);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "char_from_room", char_from_room, ch);
		RS.Queue.AddToQueue(20, "fight_prog_law_subdue", "send_to_char_queue", send_to_char_queue, "You are shaken awake by a fuzzy man, as seen through your own personal haze.\n\r", ch);
		RS.Queue.AddToQueue(20, "fight_prog_law_subdue", "act_queue", act_queue, "$N comes to $S knees holding the back of $S head.", nullptr, nullptr, ch, TO_NOTVICT);

		auto buffer = fmt::format("A Hydra trooper tells you '{}And stay out of Cimar, ye {}!{}'\n\r", get_char_color(ch, "tells"), get_insult(ch), END_COLOR(ch));
		RS.Queue.AddToQueue(21, "fight_prog_law_subdue", "send_to_char_queue", send_to_char_queue, buffer, ch);
	}
	else
	{
		act("The troopers maneuver around you, waiting for an opening.", mob, 0, ch, TO_VICT);
		act("The troopers maneuver around $N, waiting for an opening.", mob, 0, ch, TO_NOTVICT);
	}
}